

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O2

string * __thiscall
mp::SolverOption::format_description_abi_cxx11_
          (string *__return_storage_ptr__,SolverOption *this,int indent)

{
  MemoryWriter writer;
  MemoryWriter local_230;
  
  local_230.super_BasicWriter<char>.buffer_ = &local_230.buffer_.super_Buffer<char>;
  local_230.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_003993a0;
  local_230.buffer_.super_Buffer<char>.ptr_ = local_230.buffer_.data_;
  local_230.buffer_.super_Buffer<char>.size_ = 0;
  local_230.buffer_.super_Buffer<char>.capacity_ = 500;
  local_230.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_003993e8;
  format_description(this,&local_230,indent);
  fmt::BasicWriter<char>::str_abi_cxx11_(__return_storage_ptr__,&local_230.super_BasicWriter<char>);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&local_230);
  return __return_storage_ptr__;
}

Assistant:

std::string format_description(int indent=0) const {
    fmt::MemoryWriter writer;
    format_description(writer, indent);
    return writer.str();
  }